

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::accessing_bounding_box_type
               (NegativeTestContext *ctx)

{
  NegativeTestContext *ctx_00;
  int iVar1;
  RenderContext *pRVar2;
  bool bVar3;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ApiType local_18;
  ApiType local_14;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  local_14.m_bits = (*pRVar2->_vptr_RenderContext[2])();
  iVar1 = glu::ApiType::getMajorVersion(&local_14);
  bVar3 = false;
  if (iVar1 == 3) {
    pRVar2 = NegativeTestContext::getRenderContext(local_10);
    local_18.m_bits = (*pRVar2->_vptr_RenderContext[2])();
    iVar1 = glu::ApiType::getMinorVersion(&local_18);
    bVar3 = iVar1 == 1;
  }
  ctx_00 = local_10;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"gl_BoundingBoxEXT",&local_39);
    executeAccessingBoundingBoxType(ctx_00,&local_38,GLSL_VERSION_310_ES);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"gl_BoundingBox",&local_71);
    executeAccessingBoundingBoxType(ctx_00,&local_70,GLSL_VERSION_320_ES);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return;
}

Assistant:

void accessing_bounding_box_type (NegativeTestContext& ctx)
{
	// Extension requirements and name differences depending on the context
	if ((ctx.getRenderContext().getType().getMajorVersion() == 3) && (ctx.getRenderContext().getType().getMinorVersion() == 1))
	{
		executeAccessingBoundingBoxType(ctx, "gl_BoundingBoxEXT", glu::GLSL_VERSION_310_ES);
	}
	else
	{
		executeAccessingBoundingBoxType(ctx, "gl_BoundingBox", glu::GLSL_VERSION_320_ES);
	}

}